

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

double nonius::detail::erf_inv(double x)

{
  double dVar1;
  
  dVar1 = log((1.0 - x) * (x + 1.0));
  if (dVar1 <= -6.25) {
    if (dVar1 <= -16.0) {
      dVar1 = SQRT(-dVar1) + -5.0;
      dVar1 = (((((((((((((((dVar1 * -2.7109920616438573e-11 + -2.555641816996525e-10) * dVar1 +
                           1.5076572693500548e-09) * dVar1 + -3.789465440126737e-09) * dVar1 +
                         7.61570120807834e-09) * dVar1 + -1.496002662714924e-08) * dVar1 +
                       2.914795345090108e-08) * dVar1 + -6.771199775845234e-08) * dVar1 +
                     2.2900482228026655e-07) * dVar1 + -9.9298272942317e-07) * dVar1 +
                   4.526062597223154e-06) * dVar1 + -1.968177810553167e-05) * dVar1 +
                 7.599527703001776e-05) * dVar1 + -0.00021503011930044477) * dVar1 +
               -0.00013871931833623122) * dVar1 + 1.0103004648645344) * dVar1 + 4.849906401408584;
    }
    else {
      dVar1 = SQRT(-dVar1) + -3.25;
      dVar1 = (((((((((((((((((dVar1 * 2.2137376921775787e-09 + 9.075656193888539e-08) * dVar1 +
                             -2.7517406297064545e-07) * dVar1 + 1.8239629214389228e-08) * dVar1 +
                           1.5027403968909828e-06) * dVar1 + -4.013867526981546e-06) * dVar1 +
                         2.9234449089955446e-06) * dVar1 + 1.2475304481671779e-05) * dVar1 +
                       -4.7318229009055734e-05) * dVar1 + 6.828485145957318e-05) * dVar1 +
                     2.4031110387097894e-05) * dVar1 + -0.0003550375203628475) * dVar1 +
                   0.0009532893797373805) * dVar1 + -0.0016882755560235047) * dVar1 +
                 0.002491442096107851) * dVar1 + -0.003751208507569241) * dVar1 +
               0.005370914553590064) * dVar1 + 1.0052589676941592) * dVar1 + 3.0838856104922208;
    }
  }
  else {
    dVar1 = -3.125 - dVar1;
    dVar1 = (((((((((((((((((((((dVar1 * -3.64441206401782e-21 + -1.6850591381820166e-19) * dVar1 +
                               1.28584807152564e-18) * dVar1 + 1.1157877678025181e-17) * dVar1 +
                             -1.333171662854621e-16) * dVar1 + 2.0972767875968562e-17) * dVar1 +
                           6.637638134358324e-15) * dVar1 + -4.054566272975207e-14) * dVar1 +
                         -8.151934197605472e-14) * dVar1 + 2.6335093153082323e-12) * dVar1 +
                       -1.2975133253453532e-11) * dVar1 + -5.415412054294628e-11) * dVar1 +
                     1.0512122733215323e-09) * dVar1 + -4.112633980346984e-09) * dVar1 +
                   -2.9070369957882005e-08) * dVar1 + 4.2347877827932404e-07) * dVar1 +
                 -1.3654692000834679e-06) * dVar1 + -1.3882523362786469e-05) * dVar1 +
               0.00018673420803405714) * dVar1 + -0.000740702534166267) * dVar1 +
             -0.006033670871430149) * dVar1 + 0.24015818242558962) * dVar1 + 1.6536545626831027;
  }
  return dVar1 * x;
}

Assistant:

inline double erf_inv(double x) {
            // Code accompanying the article "Approximating the erfinv function" in GPU Computing Gems, Volume 2
            double w, p;

            w = - log((1.0-x)*(1.0+x));

            if (w < 6.250000) {
                w = w - 3.125000;
                p =  -3.6444120640178196996e-21;
                p =   -1.685059138182016589e-19 + p*w;
                p =   1.2858480715256400167e-18 + p*w;
                p =    1.115787767802518096e-17 + p*w;
                p =   -1.333171662854620906e-16 + p*w;
                p =   2.0972767875968561637e-17 + p*w;
                p =   6.6376381343583238325e-15 + p*w;
                p =  -4.0545662729752068639e-14 + p*w;
                p =  -8.1519341976054721522e-14 + p*w;
                p =   2.6335093153082322977e-12 + p*w;
                p =  -1.2975133253453532498e-11 + p*w;
                p =  -5.4154120542946279317e-11 + p*w;
                p =    1.051212273321532285e-09 + p*w;
                p =  -4.1126339803469836976e-09 + p*w;
                p =  -2.9070369957882005086e-08 + p*w;
                p =   4.2347877827932403518e-07 + p*w;
                p =  -1.3654692000834678645e-06 + p*w;
                p =  -1.3882523362786468719e-05 + p*w;
                p =    0.0001867342080340571352 + p*w;
                p =  -0.00074070253416626697512 + p*w;
                p =   -0.0060336708714301490533 + p*w;
                p =      0.24015818242558961693 + p*w;
                p =       1.6536545626831027356 + p*w;
            }
            else if (w < 16.000000) {
                w = sqrt(w) - 3.250000;
                p =   2.2137376921775787049e-09;
                p =   9.0756561938885390979e-08 + p*w;
                p =  -2.7517406297064545428e-07 + p*w;
                p =   1.8239629214389227755e-08 + p*w;
                p =   1.5027403968909827627e-06 + p*w;
                p =   -4.013867526981545969e-06 + p*w;
                p =   2.9234449089955446044e-06 + p*w;
                p =   1.2475304481671778723e-05 + p*w;
                p =  -4.7318229009055733981e-05 + p*w;
                p =   6.8284851459573175448e-05 + p*w;
                p =   2.4031110387097893999e-05 + p*w;
                p =   -0.0003550375203628474796 + p*w;
                p =   0.00095328937973738049703 + p*w;
                p =   -0.0016882755560235047313 + p*w;
                p =    0.0024914420961078508066 + p*w;
                p =   -0.0037512085075692412107 + p*w;
                p =     0.005370914553590063617 + p*w;
                p =       1.0052589676941592334 + p*w;
                p =       3.0838856104922207635 + p*w;
            }
            else {
                w = sqrt(w) - 5.000000;
                p =  -2.7109920616438573243e-11;
                p =  -2.5556418169965252055e-10 + p*w;
                p =   1.5076572693500548083e-09 + p*w;
                p =  -3.7894654401267369937e-09 + p*w;
                p =   7.6157012080783393804e-09 + p*w;
                p =  -1.4960026627149240478e-08 + p*w;
                p =   2.9147953450901080826e-08 + p*w;
                p =  -6.7711997758452339498e-08 + p*w;
                p =   2.2900482228026654717e-07 + p*w;
                p =  -9.9298272942317002539e-07 + p*w;
                p =   4.5260625972231537039e-06 + p*w;
                p =  -1.9681778105531670567e-05 + p*w;
                p =   7.5995277030017761139e-05 + p*w;
                p =  -0.00021503011930044477347 + p*w;
                p =  -0.00013871931833623122026 + p*w;
                p =       1.0103004648645343977 + p*w;
                p =       4.8499064014085844221 + p*w;
            }
            return p*x;
        }